

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Strided_get64(int g_a,int64_t *lo,int64_t *hi,int64_t *skip,void *buf,int64_t *ld)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R9;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_skip [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer *in_stack_000003a8;
  void *in_stack_000003b0;
  Integer *in_stack_000003b8;
  Integer *in_stack_000003c0;
  Integer *in_stack_000003c8;
  Integer in_stack_000003d0;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  undefined8 local_138 [8];
  undefined8 local_f8 [8];
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_30;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = (long)in_EDI;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = pnga_ndim(_ga_hi[4]);
  for (local_13c = 0; local_13c < local_40; local_13c = local_13c + 1) {
    local_78[(local_40 - local_13c) + -1] = *(long *)(local_10 + (long)local_13c * 8) + 1;
  }
  for (local_140 = 0; local_140 < local_40; local_140 = local_140 + 1) {
    local_b8[(local_40 - local_140) + -1] = *(long *)(local_18 + (long)local_140 * 8) + 1;
  }
  for (local_144 = 0; (long)local_144 < local_40 + -1; local_144 = local_144 + 1) {
    local_138[(local_40 - local_144) + -2] = *(undefined8 *)(local_30 + (long)local_144 * 8);
  }
  for (local_148 = 0; local_148 < local_40; local_148 = local_148 + 1) {
    local_f8[(local_40 - local_148) + -1] = *(undefined8 *)(local_20 + (long)local_148 * 8);
  }
  pnga_strided_get(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                   in_stack_000003b0,in_stack_000003a8);
  return;
}

Assistant:

void NGA_Strided_get64(int g_a, int64_t lo[], int64_t hi[], int64_t skip[],
                     void* buf, int64_t ld[])
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_skip[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    COPYC2F(skip, _ga_skip, ndim);
    wnga_strided_get(a, _ga_lo, _ga_hi, _ga_skip, buf, _ga_work);
}